

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavProcessItemForTabbingRequest(ImGuiID id)

{
  int iVar1;
  ImGuiID in_EDI;
  ImGuiNavItemData *result;
  ImGuiContext *g;
  ImGuiContext *result_00;
  
  if (GImGui->NavTabbingDir == 1) {
    result_00 = GImGui;
    if ((GImGui->NavTabbingResultFirst).ID == 0) {
      NavApplyItemToResult(result);
    }
    iVar1 = result_00->NavTabbingCounter + -1;
    result_00->NavTabbingCounter = iVar1;
    if (iVar1 == 0) {
      NavMoveRequestResolveWithLastItem((ImGuiNavItemData *)result_00);
    }
    else if (result_00->NavId == in_EDI) {
      result_00->NavTabbingCounter = 1;
    }
  }
  else if (GImGui->NavTabbingDir == -1) {
    if (GImGui->NavId == in_EDI) {
      if ((GImGui->NavMoveResultLocal).ID != 0) {
        GImGui->NavMoveScoringItems = false;
        NavUpdateAnyRequestFlag();
      }
    }
    else {
      NavApplyItemToResult(result);
    }
  }
  else if ((GImGui->NavTabbingDir == 0) && ((GImGui->NavTabbingResultFirst).ID == 0)) {
    NavMoveRequestResolveWithLastItem((ImGuiNavItemData *)GImGui);
  }
  return;
}

Assistant:

void ImGui::NavProcessItemForTabbingRequest(ImGuiID id)
{
    ImGuiContext& g = *GImGui;

    // Always store in NavMoveResultLocal (unlike directional request which uses NavMoveResultOther on sibling/flattened windows)
    ImGuiNavItemData* result = &g.NavMoveResultLocal;
    if (g.NavTabbingDir == +1)
    {
        // Tab Forward or SetKeyboardFocusHere() with >= 0
        if (g.NavTabbingResultFirst.ID == 0)
            NavApplyItemToResult(&g.NavTabbingResultFirst);
        if (--g.NavTabbingCounter == 0)
            NavMoveRequestResolveWithLastItem(result);
        else if (g.NavId == id)
            g.NavTabbingCounter = 1;
    }
    else if (g.NavTabbingDir == -1)
    {
        // Tab Backward
        if (g.NavId == id)
        {
            if (result->ID)
            {
                g.NavMoveScoringItems = false;
                NavUpdateAnyRequestFlag();
            }
        }
        else
        {
            NavApplyItemToResult(result);
        }
    }
    else if (g.NavTabbingDir == 0)
    {
        // Tab Init
        if (g.NavTabbingResultFirst.ID == 0)
            NavMoveRequestResolveWithLastItem(&g.NavTabbingResultFirst);
    }
}